

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O2

TValue * lj_clib_index(lua_State *L,CLibrary *cl,GCstr *name)

{
  uint uVar1;
  CTState *cts;
  GCtab *pGVar2;
  uint64_t uVar3;
  CTypeID CVar4;
  CType *in_RAX;
  GCobj *o;
  TValue *pTVar5;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  lua_Number lVar9;
  CType *ct;
  
  ct = in_RAX;
  pTVar5 = lj_tab_setstr(L,cl->cache,name);
  if (pTVar5->u64 == 0xffffffffffffffff) {
    cts = *(CTState **)((L->glref).ptr64 + 0x180);
    cts->L = L;
    CVar4 = lj_ctype_getname(cts,&ct,name,0x1840);
    if (CVar4 == 0) {
      lj_err_callerv(L,LJ_ERR_FFI_NODECL,name + 1);
    }
    if ((ct->info & 0xf0000000) == 0xb0000000) {
      uVar1 = ct->size;
      if (((int)uVar1 < 0 & *(byte *)((long)&cts->tab[ct->info & 0xffff].info + 2) >> 7) == 1) {
        lVar9 = (lua_Number)uVar1;
      }
      else {
        lVar9 = (lua_Number)(int)uVar1;
      }
      pTVar5->n = lVar9;
    }
    else {
      uVar8 = (ulong)ct->sib;
      if (uVar8 != 0) {
        if ((cts->tab[uVar8].info & 0xf0ff0000) == 0x80040000) {
          name = (GCstr *)cts->tab[uVar8].name.gcptr64;
        }
      }
      lVar6 = dlsym(cl->handle,name + 1);
      if (lVar6 == 0) {
        clib_error_(L);
      }
      pvVar7 = lj_mem_newgco(cts->L,0x18);
      *(undefined1 *)((long)pvVar7 + 9) = 10;
      *(short *)((long)pvVar7 + 10) = (short)CVar4;
      *(long *)((long)pvVar7 + 0x10) = lVar6;
      pTVar5->u64 = (ulong)pvVar7 | 0xfffa800000000000;
      pGVar2 = cl->cache;
      if ((pGVar2->marked & 4) != 0) {
        uVar3 = (L->glref).ptr64;
        pGVar2->marked = pGVar2->marked & 0xfb;
        (pGVar2->gclist).gcptr64 = *(uint64_t *)(uVar3 + 0x40);
        *(GCtab **)(uVar3 + 0x40) = pGVar2;
      }
    }
  }
  return pTVar5;
}

Assistant:

TValue *lj_clib_index(lua_State *L, CLibrary *cl, GCstr *name)
{
  TValue *tv = lj_tab_setstr(L, cl->cache, name);
  if (LJ_UNLIKELY(tvisnil(tv))) {
    CTState *cts = ctype_cts(L);
    CType *ct;
    CTypeID id = lj_ctype_getname(cts, &ct, name, CLNS_INDEX);
    if (!id)
      lj_err_callerv(L, LJ_ERR_FFI_NODECL, strdata(name));
    if (ctype_isconstval(ct->info)) {
      CType *ctt = ctype_child(cts, ct);
      lj_assertCTS(ctype_isinteger(ctt->info) && ctt->size <= 4,
		   "only 32 bit const supported");  /* NYI */
      if ((ctt->info & CTF_UNSIGNED) && (int32_t)ct->size < 0)
	setnumV(tv, (lua_Number)(uint32_t)ct->size);
      else
	setintV(tv, (int32_t)ct->size);
    } else {
      const char *sym = clib_extsym(cts, ct, name);
#if LJ_TARGET_WINDOWS
      DWORD oldwerr = GetLastError();
#endif
      void *p = clib_getsym(cl, sym);
      GCcdata *cd;
      lj_assertCTS(ctype_isfunc(ct->info) || ctype_isextern(ct->info),
		   "unexpected ctype %08x in clib", ct->info);
#if LJ_TARGET_X86 && LJ_ABI_WIN
      /* Retry with decorated name for fastcall/stdcall functions. */
      if (!p && ctype_isfunc(ct->info)) {
	CTInfo cconv = ctype_cconv(ct->info);
	if (cconv == CTCC_FASTCALL || cconv == CTCC_STDCALL) {
	  CTSize sz = clib_func_argsize(cts, ct);
	  const char *symd = lj_strfmt_pushf(L,
			       cconv == CTCC_FASTCALL ? "@%s@%d" : "_%s@%d",
			       sym, sz);
	  L->top--;
	  p = clib_getsym(cl, symd);
	}
      }
#endif
      if (!p)
	clib_error(L, "cannot resolve symbol " LUA_QS ": %s", sym);
#if LJ_TARGET_WINDOWS
      SetLastError(oldwerr);
#endif
      cd = lj_cdata_new(cts, id, CTSIZE_PTR);
      *(void **)cdataptr(cd) = p;
      setcdataV(L, tv, cd);
      lj_gc_anybarriert(L, cl->cache);
    }
  }
  return tv;
}